

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O1

int __thiscall libDAI::NDP::init(NDP *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ostream *poVar2;
  Exception *this_00;
  string local_40;
  
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])();
  if ((char)iVar1 == '\0') {
    this_00 = (Exception *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ndp.cpp, line 150","");
    Exception::Exception(this_00,8,&local_40);
    __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((this->Props).verbose != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"NDP initialized at verbose=",0x1b);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    iVar1 = std::ostream::flush();
    return iVar1;
  }
  return iVar1;
}

Assistant:

void NDP::init() { //messages (one for each edge?) are initialized with uniform probabilities
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);
        /*
        for( vector<Prob>::iterator mij = _messages.begin(); mij != _messages.end(); mij++ )
            //mij->fill(1.0 / mij->size());
            //mij->fill(0.0 ); //FRANS Max-plus initialized on 0.0
            mij->fill( (double) rand() * 50 / RAND_MAX ); //FRANS Max-plus initialized on 0.0
        _newmessages = _messages;
        */
        if( Props.verbose >= 1)
            cout << "NDP initialized at verbose="<<Props.verbose<<endl;
    }